

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O3

int __thiscall
capnp::TwoPartyServer::AcceptedConnection::init(AcceptedConnection *this,EVP_PKEY_CTX *ctx)

{
  Iface *pIVar1;
  int in_EAX;
  int extraout_EAX;
  Function<kj::String_(const_kj::Exception_&)> local_20;
  
  if (ctx[0x18] == (EVP_PKEY_CTX)0x1) {
    local_20.impl.ptr = (Iface *)operator_new(0x10);
    (local_20.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___006d1b60;
    local_20.impl.ptr[1]._vptr_Iface = (_func_int **)(ctx + 0x20);
    local_20.impl.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::Function<kj::String(kj::Exception_const&)>::Impl<capnp::TwoPartyServer::AcceptedConnection::init(capnp::TwoPartyServer&)::{lambda(kj::Exception_const&)#1}>>
          ::instance;
    capnp::_::RpcSystemBase::setTraceEncoder(&(this->rpcSystem).super_RpcSystemBase,&local_20);
    pIVar1 = local_20.impl.ptr;
    in_EAX = extraout_EAX;
    if (local_20.impl.ptr != (Iface *)0x0) {
      local_20.impl.ptr = (Iface *)0x0;
      in_EAX = (**(local_20.impl.disposer)->_vptr_Disposer)
                         (local_20.impl.disposer,
                          pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
    }
  }
  return in_EAX;
}

Assistant:

void init(TwoPartyServer& parent) {
    KJ_IF_SOME(func, parent.traceEncoder) {
      rpcSystem.setTraceEncoder([&func](const kj::Exception& e) {
        return func(e);
      });
    }
  }